

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O0

void ImageToPOT(Image *image,Color fill)

{
  float fVar1;
  float fVar2;
  float fVar3;
  int potHeight;
  int potWidth;
  Image *image_local;
  Color fill_local;
  
  if (((image->data != (void *)0x0) && (image->width != 0)) && (image->height != 0)) {
    fVar1 = logf((float)image->width);
    fVar2 = logf(2.0);
    fVar1 = ceilf(fVar1 / fVar2);
    fVar1 = powf(2.0,fVar1);
    fVar2 = logf((float)image->height);
    fVar3 = logf(2.0);
    fVar2 = ceilf(fVar2 / fVar3);
    fVar2 = powf(2.0,fVar2);
    if (((int)fVar1 != image->width) || ((int)fVar2 != image->height)) {
      ImageResizeCanvas(image,(int)fVar1,(int)fVar2,0,0,fill);
    }
  }
  return;
}

Assistant:

void ImageToPOT(Image *image, Color fill)
{
    // Security check to avoid program crash
    if ((image->data == NULL) || (image->width == 0) || (image->height == 0)) return;

    // Calculate next power-of-two values
    // NOTE: Just add the required amount of pixels at the right and bottom sides of image...
    int potWidth = (int)powf(2, ceilf(logf((float)image->width)/logf(2)));
    int potHeight = (int)powf(2, ceilf(logf((float)image->height)/logf(2)));

    // Check if POT texture generation is required (if texture is not already POT)
    if ((potWidth != image->width) || (potHeight != image->height)) ImageResizeCanvas(image, potWidth, potHeight, 0, 0, fill);
}